

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsGetPropertyIdType(JsPropertyIdRef propertyId,JsPropertyIdType *propertyIdType)

{
  JsErrorCode JVar1;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  JVar1 = JsErrorInvalidArgument;
  if ((propertyId != (JsPropertyIdRef)0x0) && (0xf < *(uint *)((long)propertyId + 8))) {
    *propertyIdType = (uint)*(byte *)((long)propertyId + 0x12);
    JVar1 = JsNoError;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetPropertyIdType(_In_ JsPropertyIdRef propertyId, _Out_ JsPropertyIdType* propertyIdType)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_PROPERTYID(propertyId);

        Js::PropertyRecord const * propertyRecord = (Js::PropertyRecord const *)propertyId;

        if (propertyRecord->IsSymbol())
        {
            *propertyIdType = JsPropertyIdTypeSymbol;
        }
        else
        {
            *propertyIdType = JsPropertyIdTypeString;
        }
        return JsNoError;
    });
}